

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_FloatToString.h
# Opt level: O1

void __thiscall
choc::text::FloatToStringBuffer<float>::Limits::Limits(Limits *this,MantissaAndExponent value)

{
  int iVar1;
  long lVar2;
  uint64_t uVar3;
  ulong uVar4;
  int iVar5;
  
  uVar3 = value.mantissa;
  uVar4 = uVar3 * 2 + 1;
  iVar1 = value.exponent + -1;
  (this->upper).mantissa = uVar4;
  (this->upper).exponent = iVar1;
  if (((uint)value.mantissa >> 0x17 & 1) == 0) {
    lVar2 = 0x3f;
    if ((uVar4 & 0xffffff) != 0) {
      for (; ((uint)uVar4 & 0xffffff) >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    uVar4 = uVar4 << (~(byte)lVar2 + 0x19 & 0x3f);
    (this->upper).exponent = ((this->upper).exponent - ((uint)lVar2 ^ 0x3f)) + 0x27;
    (this->upper).mantissa = uVar4;
  }
  iVar5 = (this->upper).exponent + -0x27;
  if (uVar3 == 0x800000) {
    iVar1 = value.exponent + -2;
  }
  lVar2 = 0x1ffffff;
  if (uVar3 != 0x800000) {
    lVar2 = uVar3 * 2 + -1;
  }
  (this->upper).mantissa = uVar4 << 0x27;
  (this->upper).exponent = iVar5;
  (this->lower).mantissa = lVar2 << ((char)iVar1 - (char)iVar5 & 0x3fU);
  (this->lower).exponent = iVar5;
  return;
}

Assistant:

constexpr Limits (MantissaAndExponent value)
        {
            upper = { (value.mantissa << 1) + 1, value.exponent - 1 };

            while ((upper.mantissa & (hiddenBit << 1)) == 0)
                upper = upper.shiftedUp (1);

            upper = upper.shiftedUp (static_cast<int> (sizeof (upper.mantissa) * 8 - numSignificandBits - 2));

            lower = value.mantissa == hiddenBit ? MantissaAndExponent { (value.mantissa << 2) - 1, value.exponent - 2 }
                                                : MantissaAndExponent { (value.mantissa << 1) - 1, value.exponent - 1 };
            lower.mantissa <<= lower.exponent - upper.exponent;
            lower.exponent = upper.exponent;
        }